

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_4::ViewportParamTestInstane::setDynamicStates
          (ViewportParamTestInstane *this)

{
  undefined1 local_38 [8];
  VkRect2D scissor;
  VkViewport viewport;
  ViewportParamTestInstane *this_local;
  
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  scissor.offset.x = 0x80;
  scissor.offset.y = 0x80;
  DynamicStateBaseClass::setDynamicViewportState
            ((DynamicStateBaseClass *)this,1,(VkViewport *)&scissor.extent,(VkRect2D *)local_38);
  DynamicStateBaseClass::setDynamicRasterizationState((DynamicStateBaseClass *)this,1.0,0.0,0.0,0.0)
  ;
  DynamicStateBaseClass::setDynamicBlendState((DynamicStateBaseClass *)this,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            ((DynamicStateBaseClass *)this,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,0xffffffff,0)
  ;
  return;
}

Assistant:

virtual void setDynamicStates(void)
	{
		const vk::VkViewport viewport	= { 0.0f, 0.0f, (float)WIDTH * 2, (float)HEIGHT * 2, 0.0f, 0.0f };
		const vk::VkRect2D scissor		= { { 0, 0 }, { WIDTH, HEIGHT } };

		setDynamicViewportState(1, &viewport, &scissor);
		setDynamicRasterizationState();
		setDynamicBlendState();
		setDynamicDepthStencilState();
	}